

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

IVec4 __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredImage::getPixelInt
          (LayeredImage *this,int x,int y,int z)

{
  CubeFace face;
  undefined4 in_register_00000034;
  LayeredImage *this_00;
  int in_R8D;
  IVec4 IVar1;
  undefined1 local_50 [8];
  ConstPixelBufferAccess access;
  int z_local;
  int y_local;
  int x_local;
  LayeredImage *this_local;
  
  this_00 = (LayeredImage *)CONCAT44(in_register_00000034,x);
  if (this_00->m_type == TEXTURETYPE_CUBE) {
    face = glslImageFuncZToCubeFace(in_R8D);
    getCubeFaceAccess((ConstPixelBufferAccess *)local_50,this_00,face);
  }
  else {
    getAccess((ConstPixelBufferAccess *)local_50,this_00);
  }
  IVar1 = tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)this,(int)local_50,y,z)
  ;
  IVar1.m_data._0_8_ = this;
  return (IVec4)IVar1.m_data;
}

Assistant:

IVec4 LayeredImage::getPixelInt (int x, int y, int z) const
{
	const ConstPixelBufferAccess access = m_type == TEXTURETYPE_CUBE ? getCubeFaceAccess(glslImageFuncZToCubeFace(z)) : getAccess();
	return access.getPixelInt(x, y, m_type == TEXTURETYPE_CUBE ? 0 : z);
}